

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashdyn.c
# Opt level: O2

void tommy_hashdyn_insert
               (tommy_hashdyn *hashdyn,tommy_hashdyn_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tommy_list_insert_tail(hashdyn->bucket + (hashdyn->bucket_mask & hash),node,data);
  node->key = hash;
  uVar2 = hashdyn->count + 1;
  hashdyn->count = uVar2;
  if (uVar2 < hashdyn->bucket_max >> 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tommy_hashdyn_resize(hashdyn,hashdyn->bucket_bit + 1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashdyn_insert(tommy_hashdyn* hashdyn, tommy_hashdyn_node* node, void* data, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashdyn->bucket_mask;

	tommy_list_insert_tail(&hashdyn->bucket[pos], node, data);

	node->key = hash;

	++hashdyn->count;

	hashdyn_grow_step(hashdyn);
}